

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O1

CK_RV __thiscall
SessionManager::openSession
          (SessionManager *this,Slot *slot,CK_FLAGS flags,CK_VOID_PTR pApplication,CK_NOTIFY notify,
          CK_SESSION_HANDLE_PTR phSession)

{
  pointer *pppSVar1;
  long lVar2;
  pointer ppSVar3;
  iterator __position;
  bool bVar4;
  Token *this_00;
  Session *this_01;
  long lVar5;
  CK_SESSION_HANDLE CVar6;
  CK_RV CVar7;
  Session *session;
  MutexLocker lock;
  Session *local_58;
  SessionManager *local_50;
  CK_NOTIFY local_48;
  MutexLocker local_40;
  
  if (phSession == (CK_SESSION_HANDLE_PTR)0x0) {
    return 7;
  }
  if (slot == (Slot *)0x0) {
    return 3;
  }
  if ((flags & 4) == 0) {
    return 0xb4;
  }
  local_50 = this;
  local_48 = notify;
  MutexLocker::MutexLocker(&local_40,this->sessionsMutex);
  this_00 = Slot::getToken(slot);
  if (this_00 == (Token *)0x0) {
    CVar7 = 0xe0;
  }
  else {
    bVar4 = Token::isInitialized(this_00);
    CVar7 = 0xe1;
    if (bVar4) {
      if ((flags & 2) == 0) {
        bVar4 = Token::isSOLoggedIn(this_00);
        CVar7 = 0xb8;
        if (bVar4) goto LAB_00170526;
      }
      this_01 = (Session *)operator_new(0xa8);
      Session::Session(this_01,slot,SUB41(((uint)flags & 2) >> 1,0),pApplication,local_48);
      ppSVar3 = (local_50->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(local_50->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3;
      local_58 = this_01;
      if (lVar5 != 0) {
        lVar5 = lVar5 >> 3;
        CVar6 = 1;
        do {
          if (ppSVar3[CVar6 - 1] == (Session *)0x0) {
            ppSVar3[CVar6 - 1] = this_01;
            Session::setHandle(this_01,CVar6);
            CVar6 = Session::getHandle(local_58);
            goto LAB_00170520;
          }
          lVar2 = (-(ulong)(lVar5 == 0) - lVar5) + CVar6;
          CVar6 = CVar6 + 1;
        } while (lVar2 != 0);
      }
      __position._M_current =
           (local_50->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_50->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Session*,std::allocator<Session*>>::_M_realloc_insert<Session*const&>
                  ((vector<Session*,std::allocator<Session*>> *)&local_50->sessions,__position,
                   &local_58);
      }
      else {
        *__position._M_current = this_01;
        pppSVar1 = &(local_50->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
      Session::setHandle(local_58,(long)(local_50->sessions).
                                        super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_50->sessions).
                                        super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3);
      CVar6 = Session::getHandle(local_58);
LAB_00170520:
      *phSession = CVar6;
      CVar7 = 0;
    }
  }
LAB_00170526:
  MutexLocker::~MutexLocker(&local_40);
  return CVar7;
}

Assistant:

CK_RV SessionManager::openSession
(
	Slot* slot,
	CK_FLAGS flags,
	CK_VOID_PTR pApplication,
	CK_NOTIFY notify,
	CK_SESSION_HANDLE_PTR phSession
)
{
	if (phSession == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (slot == NULL) return CKR_SLOT_ID_INVALID;
	if ((flags & CKF_SERIAL_SESSION) == 0) return CKR_SESSION_PARALLEL_NOT_SUPPORTED;

	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	// Get the token
	Token* token = slot->getToken();
	if (token == NULL) return CKR_TOKEN_NOT_PRESENT;
	if (!token->isInitialized()) return CKR_TOKEN_NOT_RECOGNIZED;

	// Can not open a Read-Only session when in SO mode
	if ((flags & CKF_RW_SESSION) == 0 && token->isSOLoggedIn()) return CKR_SESSION_READ_WRITE_SO_EXISTS;

	// TODO: Do we want to check for maximum number of sessions?
	// return CKR_SESSION_COUNT

	// Create the session
	bool rwSession = ((flags & CKF_RW_SESSION) == CKF_RW_SESSION) ? true : false;
	Session* session = new Session(slot, rwSession, pApplication, notify);

	// First fill any empty spot in the list
	for (size_t i = 0; i < sessions.size(); i++)
	{
		if (sessions[i] != NULL)
		{
			continue;
		}

		sessions[i] = session;
		session->setHandle(i + 1);
		*phSession = session->getHandle();

		return CKR_OK;
	}

	// Or add it to the end
	sessions.push_back(session);
	session->setHandle(sessions.size());
	*phSession = session->getHandle();

	return CKR_OK;
}